

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

void xmlRelaxNGFree(xmlRelaxNGPtr schema)

{
  int i;
  long lVar1;
  
  if (schema != (xmlRelaxNGPtr)0x0) {
    if (schema->topgrammar != (xmlRelaxNGGrammarPtr_conflict)0x0) {
      xmlRelaxNGFreeGrammar(schema->topgrammar);
    }
    if (schema->doc != (xmlDocPtr)0x0) {
      xmlFreeDoc(schema->doc);
    }
    if (schema->documents != (xmlRelaxNGDocumentPtr_conflict)0x0) {
      xmlRelaxNGFreeDocumentList(schema->documents);
    }
    if (schema->includes != (xmlRelaxNGIncludePtr_conflict)0x0) {
      xmlRelaxNGFreeIncludeList(schema->includes);
    }
    if (schema->defTab != (xmlRelaxNGDefinePtr_conflict *)0x0) {
      for (lVar1 = 0; lVar1 < schema->defNr; lVar1 = lVar1 + 1) {
        xmlRelaxNGFreeDefine(schema->defTab[lVar1]);
      }
      (*xmlFree)(schema->defTab);
    }
    (*xmlFree)(schema);
    return;
  }
  return;
}

Assistant:

void
xmlRelaxNGFree(xmlRelaxNGPtr schema)
{
    if (schema == NULL)
        return;

    if (schema->topgrammar != NULL)
        xmlRelaxNGFreeGrammar(schema->topgrammar);
    if (schema->doc != NULL)
        xmlFreeDoc(schema->doc);
    if (schema->documents != NULL)
        xmlRelaxNGFreeDocumentList(schema->documents);
    if (schema->includes != NULL)
        xmlRelaxNGFreeIncludeList(schema->includes);
    if (schema->defTab != NULL) {
        int i;

        for (i = 0; i < schema->defNr; i++)
            xmlRelaxNGFreeDefine(schema->defTab[i]);
        xmlFree(schema->defTab);
    }

    xmlFree(schema);
}